

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

void generate_stats(int *st,int *spent,int *inc,int *left)

{
  player_class *ppVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  uint *points_inc_local;
  int *points_inc_local_00;
  int *points_spent_local;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *points_spent_local_00;
  int *extraout_RDX_01;
  int *extraout_RDX_02;
  wchar_t wVar5;
  wchar_t wVar6;
  int *in_R8;
  undefined1 in_R9B;
  long lVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  undefined4 local_48;
  byte local_44;
  wchar_t local_40;
  int local_3c;
  int local_38;
  wchar_t local_34;
  
  local_44 = 0;
  local_48 = 0;
  ppVar1 = player->class;
  local_40 = L'\0';
  if ((ppVar1->magic).total_spells != L'\0') {
    local_40 = ((ppVar1->magic).books)->realm->stat;
  }
  wVar5 = L'\0';
  if (points_left != L'\0') {
    local_34 = ppVar1->max_attacks;
    points_spent_local = (int *)(ulong)(uint)local_34;
    lVar7 = (long)local_40;
    local_3c = (uint)(local_34 < L'\x05') * 2 + 1;
    bVar10 = 0;
    iVar9 = 10;
    local_38 = 10;
    iVar8 = 0;
    do {
      wVar6 = local_34;
      points_inc_local = &switchD_001b41e9::switchdataD_00233990;
      wVar5 = points_left;
      switch(iVar8) {
      case 0:
        iVar8 = local_3c;
        if (((char)local_48 == '\0') && (stats[0] < 0x11)) {
          _Var2 = buy_stat(L'\0',(int *)0x0,points_spent_local,
                           (int *)&switchD_001b41e9::switchdataD_00233990,in_R8,(_Bool)in_R9B);
          points_spent_local = extraout_RDX;
          iVar8 = 0;
          if (!_Var2) {
            local_48 = CONCAT31(local_48._1_3_,1);
          }
        }
        break;
      case 1:
        iVar8 = 2;
        if ((local_48._3_1_ == '\0') && (stats[3] < 0x11)) {
          _Var2 = buy_stat(L'\x03',(int *)0x1,points_spent_local,
                           (int *)&switchD_001b41e9::switchdataD_00233990,in_R8,(_Bool)in_R9B);
          if (!_Var2) {
            local_48 = CONCAT13(1,(undefined3)local_48);
          }
          iVar8 = (player->state).num_blows / 10;
          if (local_38 < iVar8) {
            local_38 = iVar8;
            iVar9 = stats[3];
          }
          points_spent_local = extraout_RDX_01;
          iVar8 = 1;
        }
        break;
      case 2:
        iVar8 = 3;
        uVar3 = stats[3];
        iVar4 = points_spent[3];
        if (iVar9 < stats[3]) {
          do {
            if (10 < (int)uVar3) {
              points_inc[3] = birth_stat_costs[uVar3];
              points_spent_local = (int *)(ulong)(uint)points_inc[3];
              uVar3 = uVar3 - 1;
              iVar4 = iVar4 - points_inc[3];
              wVar5 = wVar5 + points_inc[3];
              stats[3] = uVar3;
              points_spent[3] = iVar4;
              points_left = wVar5;
            }
          } while (iVar9 < (int)uVar3);
          local_48 = local_48 & 0xffffff;
        }
        break;
      case 3:
        if (local_34 < L'\x06') {
          wVar5 = points_left / 2;
          bVar10 = *(byte *)((long)&local_48 + lVar7);
          points_inc_local_00 = (int *)points_inc_local;
          while( true ) {
            if (((bVar10 & 1) != 0) ||
               (((points_inc_local_00 = points_spent, L'\x04' < wVar6 && (0x11 < stats[lVar7])) ||
                (wVar5 <= points_spent[lVar7])))) goto LAB_001b43dc;
            _Var2 = buy_stat(local_40,(int *)0x0,points_spent_local,points_spent,in_R8,(_Bool)in_R9B
                            );
            if (wVar5 < points_spent[lVar7]) break;
            points_inc_local_00 = points_spent;
            points_spent_local = points_spent_local_00;
            if (!_Var2) {
              bVar10 = 1;
            }
          }
          sell_stat(local_40,(int *)0x0,points_spent_local_00,points_inc_local_00,in_R8,
                    (_Bool)in_R9B);
          bVar10 = 1;
          points_spent_local = extraout_RDX_02;
LAB_001b43dc:
          *(byte *)((long)&local_48 + lVar7) = bVar10;
          points_inc_local = (uint *)points_inc_local_00;
          bVar10 = local_44;
        }
        if ((((bVar10 & 1) == 0) && (stats[4] < 0x10)) && (points_spent[4] < wVar5)) {
          while( true ) {
            _Var2 = buy_stat(L'\x04',(int *)0x0,points_spent_local,(int *)points_inc_local,in_R8,
                             (_Bool)in_R9B);
            points_inc_local = (uint *)(ulong)(uint)points_spent[4];
            points_spent_local = (int *)(ulong)(uint)stats[4];
            if (wVar5 < points_spent[4]) break;
            if (!_Var2) {
              bVar10 = 1;
            }
            if ((((bVar10 & 1) != 0) || (0xf < stats[4])) || (wVar5 <= points_spent[4]))
            goto LAB_001b4467;
          }
          bVar10 = 1;
          if (10 < stats[4]) {
            points_inc[4] = birth_stat_costs[(long)points_spent_local];
            stats[4] = stats[4] - 1;
            points_spent_local = (int *)(ulong)(uint)stats[4];
            points_spent[4] = points_spent[4] - points_inc[4];
            points_left = points_left + points_inc[4];
          }
        }
LAB_001b4467:
        local_44 = bVar10;
        goto LAB_001b446c;
      case 4:
        wVar5 = L'\x03';
        if ((local_48._3_1_ == '\x01') &&
           ((local_48._1_1_ != '\0' || (wVar5 = L'\x01', local_40 == L'\x01')))) {
          iVar8 = 5;
          if ((local_48._2_1_ != '\0') || (wVar5 = L'\x02', local_40 == L'\x02')) break;
        }
        do {
          _Var2 = buy_stat(wVar5,(int *)0x0,points_spent_local,(int *)points_inc_local,in_R8,
                           (_Bool)in_R9B);
          points_spent_local = extraout_RDX_00;
        } while (_Var2);
        *(undefined1 *)((long)&local_48 + (ulong)(uint)wVar5) = 1;
LAB_001b446c:
        iVar8 = 4;
        break;
      default:
        goto switchD_001b41e9_default;
      }
      wVar5 = points_left;
    } while (points_left != L'\0');
  }
switchD_001b41e9_default:
  wVar6 = L'\x00295880';
  event_signal_birthpoints(points_spent,points_inc,wVar5);
  recalculate_stats((int *)(ulong)(uint)points_left,wVar6);
  return;
}

Assistant:

static void generate_stats(int st[STAT_MAX], int spent[STAT_MAX],
		int inc[STAT_MAX], int *left)
{
	int step = 0;
	bool maxed[STAT_MAX] = { 0 };
	/* Hack - for now, just use stat of first book - NRM */
	int spell_stat = player->class->magic.total_spells ?
		player->class->magic.books[0].realm->stat : 0;
	bool caster = player->class->max_attacks < 5 ? true : false;
	bool warrior = player->class->max_attacks > 5 ? true : false;
	int blows = 10;
	int dex_break = 10;

	while (*left && step >= 0) {
	
		switch (step) {
		
			/* Buy base STR 17 */
			case 0: {
			
				if (!maxed[STAT_STR] && st[STAT_STR] < 17) {
					if (!buy_stat(STAT_STR, st, spent, inc,
							left, false))
						maxed[STAT_STR] = true;
				} else {
					step++;
					
					/* If pure caster skip to step 3 */
					if (caster) {
						step = 3;
					}
				}

				break;
			}

			/* Buy base DEX of 17, record best breakpoint */
			case 1: {
				if (!maxed[STAT_DEX] && st[STAT_DEX] < 17) {
					if (!buy_stat(STAT_DEX, st, spent, inc,
							left, true)) {
						maxed[STAT_DEX] = true;
					}
					if (player->state.num_blows / 10 > blows) {
						blows = player->state.num_blows / 10;
						dex_break = st[STAT_DEX];
					}
				} else {
					step++;
				}

				break;
			}

			/* Sell back DEX that isn't getting us an extra blow. */
			case 2: {
				while (st[STAT_DEX] > dex_break) {
					sell_stat(STAT_DEX, st, spent, inc,
						left, false);
					maxed[STAT_DEX] = false;
				}
				step++;
				break;
			}

			/* 
			 * Spend up to half remaining points on each of spell-stat and 
			 * con, but only up to max base of 16 unless a pure class 
			 * [caster or warrior]
			 */
			case 3: 
			{
				int points_trigger = *left / 2;
				
				if (warrior) {
					points_trigger = *left;
				} else {
					while (!maxed[spell_stat] &&
						   (caster || st[spell_stat] < 18) &&
						   spent[spell_stat] < points_trigger) {

						if (!buy_stat(spell_stat, st,
								spent, inc,
								left, false)) {
							maxed[spell_stat] = true;
						}

						if (spent[spell_stat] > points_trigger) {
						
							sell_stat(spell_stat,
								st, spent, inc,
								left, false);
							maxed[spell_stat] = true;
						}
					}
				}

				while (!maxed[STAT_CON] &&
					   st[STAT_CON] < 16 &&
					   spent[STAT_CON] < points_trigger) {
					   
					if (!buy_stat(STAT_CON, st, spent, inc,
							left, false)) {
						maxed[STAT_CON] = true;
					}

					if (spent[STAT_CON] > points_trigger) {
						sell_stat(STAT_CON, st, spent,
							inc, left, false);
						maxed[STAT_CON] = true;
					}
				}
				
				step++;
				break;
			}

			/* 
			 * If there are any points left, spend as much as possible in 
			 * order on DEX, and the non-spell-stat. 
			 */
			case 4:{
			
				int next_stat;

				if (!maxed[STAT_DEX]) {
					next_stat = STAT_DEX;
				} else if (!maxed[STAT_INT] && spell_stat != STAT_INT) {
					next_stat = STAT_INT;
				} else if (!maxed[STAT_WIS] && spell_stat != STAT_WIS) {
					next_stat = STAT_WIS;
				} else {
					step++;
					break;
				}

				/* Buy until we can't buy any more. */
				while (buy_stat(next_stat, st, spent, inc, left,
						false));
				maxed[next_stat] = true;

				break;
			}

			default: {
			
				step = -1;
				break;
			}
		}
	}
	/* Tell the UI the new points situation. */
	event_signal_birthpoints(spent, inc, *left);

	/* Recalculate everything that's changed because
	   the stat has changed, and inform the UI. */
	recalculate_stats(st, *left);
}